

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O2

ValidPointers<SmallAllocationBlockAttributes> __thiscall
Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GetValidPointersForIndex
          (ValidPointersMap<SmallAllocationBlockAttributes> *this,uint bucketIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValidPointers<SmallAllocationBlockAttributes> local_30;
  
  if (0x2f < bucketIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x17c,"(bucketIndex < TBlockAttributes::BucketCount)",
                       "bucketIndex < TBlockAttributes::BucketCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ValidPointers<SmallAllocationBlockAttributes>::ValidPointers
            (&local_30,this->validPointersBuffer[bucketIndex],bucketIndex);
  return local_30;
}

Assistant:

inline const ValidPointers<TBlockAttributes> GetValidPointersForIndex(uint bucketIndex) const
        {
            AnalysisAssert(bucketIndex < TBlockAttributes::BucketCount);
            ushort const * validPointers = nullptr;
#if USE_VPM_TABLE
            validPointers = validPointersBuffer[bucketIndex];
#endif
            return ValidPointers<TBlockAttributes>(validPointers, bucketIndex);
        }